

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFExpression.cpp
# Opt level: O2

bool __thiscall
llvm::DWARFExpression::Operation::print
          (Operation *this,raw_ostream *OS,DWARFExpression *Expr,MCRegisterInfo *RegInfo,
          DWARFUnit *U,bool isEH)

{
  bool bVar1;
  byte bVar2;
  Encoding EVar3;
  uint8_t uVar4;
  Tag TVar5;
  uint *puVar6;
  raw_ostream *prVar7;
  DWARFFormValue *this_00;
  long lVar8;
  uint RegNum;
  char *pcVar9;
  uint uVar10;
  uint i;
  ulong uVar11;
  StringRef Str;
  Optional<const_char_*> OVar12;
  anon_union_8_2_fc7899a5_for_OptionalStorage<const_char_*,_true>_2 local_c0;
  undefined1 local_b8;
  DWARFExpression *local_b0;
  DWARFUnit *local_a8;
  raw_ostream *local_a0;
  _func_int **local_98;
  undefined1 local_90 [8];
  Optional<llvm::DWARFFormValue> Name;
  Optional<unsigned_int> LLVMRegNum;
  long local_40;
  
  bVar1 = this->Error;
  local_b0 = Expr;
  if (bVar1 == true) {
    pcVar9 = "<decoding error>";
LAB_00d9a52a:
    raw_ostream::operator<<(OS,pcVar9);
  }
  else {
    Str = dwarf::OperationEncodingString((uint)this->Opcode);
    if (Str.Length == 0) {
      __assert_fail("!Name.empty() && \"DW_OP has no name!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFExpression.cpp"
                    ,0xf8,
                    "bool llvm::DWARFExpression::Operation::print(raw_ostream &, const DWARFExpression *, const MCRegisterInfo *, DWARFUnit *, bool)"
                   );
    }
    raw_ostream::operator<<(OS,Str);
    bVar2 = this->Opcode;
    uVar10 = (uint)bVar2;
    if ((((byte)(bVar2 + 0xb0) < 0x40) || ((uVar10 | 2) == 0x92)) &&
       (RegInfo != (MCRegisterInfo *)0x0)) {
      if ((uVar10 | 2) == 0x92) {
        RegNum = (uint)this->Operands[0];
        local_40 = 1;
      }
      else {
        if ((byte)(bVar2 + 0x90) < 0x22) {
          RegNum = uVar10 - 0x70;
        }
        else {
          RegNum = uVar10 - 0x50;
        }
        local_40 = 0;
      }
      Name.Storage._48_8_ = MCRegisterInfo::getLLVMRegNum(RegInfo,RegNum,isEH);
      if ((Name.Storage._48_8_ & 0x100000000) != 0) {
        puVar6 = optional_detail::OptionalStorage<unsigned_int,_true>::getValue
                           ((OptionalStorage<unsigned_int,_true> *)&Name.Storage.hasVal);
        pcVar9 = MCRegisterInfo::getName(RegInfo,(MCRegister)*puVar6);
        if ((uint8_t *)pcVar9 != (uint8_t *)0x0) {
          if (uVar10 == 0x92 || (byte)(bVar2 + 0x90) < 0x20) {
            Name.Storage.field_0._0_8_ = anon_var_dwarf_3b4467f;
            local_90 = (undefined1  [8])&PTR_home_01128000;
            Name.Storage.field_0.value.Value.field_0 =
                 *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + local_40);
            Name.Storage.field_0.value.Value.data = (uint8_t *)pcVar9;
            raw_ostream::operator<<(OS,(format_object_base *)local_90);
            goto LAB_00d9a52f;
          }
          OS = raw_ostream::operator<<(OS,' ');
          goto LAB_00d9a52a;
        }
      }
    }
    local_98 = (_func_int **)&PTR_home_011281f8;
    local_a8 = U;
    local_a0 = OS;
    for (lVar8 = 0; (lVar8 != 2 && (EVar3 = (this->Desc).Op[lVar8], EVar3 != SizeNA));
        lVar8 = lVar8 + 1) {
      if ((U == (DWARFUnit *)0x0) || (EVar3 != BaseTypeRef)) {
        if (EVar3 == SizeBlock) {
          Name.Storage._48_8_ = (DWARFUnit *)this->Operands[lVar8];
          for (uVar11 = 0; U = local_a8, uVar11 < this->Operands[(int)lVar8 - 1];
              uVar11 = (ulong)((int)uVar11 + 1)) {
            uVar4 = DataExtractor::getU8
                              (&local_b0->Data,(uint64_t *)&Name.Storage.hasVal,(Error *)0x0);
            Name.Storage.field_0._0_8_ = anon_var_dwarf_3b3d8d0;
            local_90 = (undefined1  [8])&PTR_home_01127e18;
            Name.Storage.field_0._8_1_ = uVar4;
            raw_ostream::operator<<(OS,(format_object_base *)local_90);
          }
        }
        else {
          if ((char)EVar3 < '\0') {
            Name.Storage.field_0.value.Value.field_0 =
                 *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar8);
            Name.Storage.field_0._0_8_ = anon_var_dwarf_3a6ceb9;
            local_90 = (undefined1  [8])local_98;
            goto LAB_00d9a840;
          }
          if ((this->Opcode != 0xa3) && (this->Opcode != 0xf3)) {
            pcVar9 = " 0x%lx";
            goto LAB_00d9a82c;
          }
        }
      }
      else {
        join_0x00000010_0x00000000_ =
             DWARFUnit::getDIEForOffset(U,this->Operands[lVar8] + (U->Header).Offset);
        if ((Name._56_8_ == (DWARFDebugInfoEntry *)0x0 || Name.Storage._48_8_ == (DWARFUnit *)0x0)
           || (TVar5 = DWARFDie::getTag((DWARFDie *)&Name.Storage.hasVal), TVar5 != DW_TAG_base_type
              )) {
          pcVar9 = " <invalid base_type ref: 0x%lx>";
LAB_00d9a82c:
          local_90 = (undefined1  [8])&PTR_home_01127cf0;
          Name.Storage.field_0.value.Value.field_0 =
               *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(this->Operands + lVar8);
          Name.Storage.field_0._0_8_ = pcVar9;
LAB_00d9a840:
          raw_ostream::operator<<(OS,(format_object_base *)local_90);
        }
        else {
          Name.Storage.field_0.value.Value.field_0 =
               (anon_union_8_3_82d75f4a_for_ValueType_0)(this->Operands[lVar8] + (U->Header).Offset)
          ;
          Name.Storage.field_0._0_8_ = anon_var_dwarf_3b3d880;
          local_90 = (undefined1  [8])&PTR_home_01127cf0;
          raw_ostream::operator<<(OS,(format_object_base *)local_90);
          OS = local_a0;
          DWARFDie::find((Optional<llvm::DWARFFormValue> *)local_90,(DWARFDie *)&Name.Storage.hasVal
                         ,DW_AT_name);
          if (Name.Storage.field_0._40_1_ == '\x01') {
            prVar7 = raw_ostream::operator<<(OS," \"");
            this_00 = optional_detail::OptionalStorage<llvm::DWARFFormValue,_true>::getValue
                                ((OptionalStorage<llvm::DWARFFormValue,_true> *)local_90);
            OVar12 = DWARFFormValue::getAsCString(this_00);
            local_c0 = OVar12.Storage.field_0;
            local_b8 = OVar12.Storage.hasVal;
            prVar7 = llvm::operator<<(prVar7,(Optional<const_char_*> *)&local_c0);
            raw_ostream::operator<<(prVar7,"\"");
          }
        }
      }
    }
  }
LAB_00d9a52f:
  return (bool)(bVar1 ^ 1);
}

Assistant:

bool DWARFExpression::Operation::print(raw_ostream &OS,
                                       const DWARFExpression *Expr,
                                       const MCRegisterInfo *RegInfo,
                                       DWARFUnit *U,
                                       bool isEH) {
  if (Error) {
    OS << "<decoding error>";
    return false;
  }

  StringRef Name = OperationEncodingString(Opcode);
  assert(!Name.empty() && "DW_OP has no name!");
  OS << Name;

  if ((Opcode >= DW_OP_breg0 && Opcode <= DW_OP_breg31) ||
      (Opcode >= DW_OP_reg0 && Opcode <= DW_OP_reg31) ||
      Opcode == DW_OP_bregx || Opcode == DW_OP_regx)
    if (prettyPrintRegisterOp(OS, Opcode, Operands, RegInfo, isEH))
      return true;

  for (unsigned Operand = 0; Operand < 2; ++Operand) {
    unsigned Size = Desc.Op[Operand];
    unsigned Signed = Size & Operation::SignBit;

    if (Size == Operation::SizeNA)
      break;

    if (Size == Operation::BaseTypeRef && U) {
      auto Die = U->getDIEForOffset(U->getOffset() + Operands[Operand]);
      if (Die && Die.getTag() == dwarf::DW_TAG_base_type) {
        OS << format(" (0x%08" PRIx64 ")", U->getOffset() + Operands[Operand]);
        if (auto Name = Die.find(dwarf::DW_AT_name))
          OS << " \"" << Name->getAsCString() << "\"";
      } else {
        OS << format(" <invalid base_type ref: 0x%" PRIx64 ">",
                     Operands[Operand]);
      }
    } else if (Size == Operation::SizeBlock) {
      uint64_t Offset = Operands[Operand];
      for (unsigned i = 0; i < Operands[Operand - 1]; ++i)
        OS << format(" 0x%02x", Expr->Data.getU8(&Offset));
    } else {
      if (Signed)
        OS << format(" %+" PRId64, (int64_t)Operands[Operand]);
      else if (Opcode != DW_OP_entry_value &&
               Opcode != DW_OP_GNU_entry_value)
        OS << format(" 0x%" PRIx64, Operands[Operand]);
    }
  }
  return true;
}